

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleWriteCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool append)

{
  pointer pcVar1;
  bool bVar2;
  char *__s;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Ios_Openmode _Var5;
  pointer pbVar6;
  mode_t mode;
  string fileName;
  string message;
  string dir;
  ofstream file;
  mode_t local_2dc;
  string local_2d8;
  string local_2b8;
  string local_298;
  pointer local_278;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  char local_240;
  undefined7 uStack_23f;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  pcVar1 = pbVar6[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d8,pcVar1,pcVar1 + pbVar6[1]._M_string_length);
  bVar2 = cmsys::SystemTools::FileIsFullPath(pbVar6[1]._M_dataplus._M_p);
  if (!bVar2) {
    __s = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    local_278 = pbVar6;
    strlen(__s);
    pbVar6 = local_278;
    std::__cxx11::string::_M_replace
              ((ulong)&local_2d8,0,(char *)local_2d8._M_string_length,(ulong)__s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   "/",pbVar6 + 1);
    std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
  }
  bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,local_2d8._M_dataplus._M_p)
  ;
  if (!bVar2) {
    std::operator+(&local_298,"attempted to write a file: ",&local_2d8);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_298);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 == paVar4) {
      local_220._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_220._8_8_ = plVar3[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_230 = (undefined1  [8])*plVar3;
    }
    local_228 = plVar3[1];
    *plVar3 = (long)paVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
    cmSystemTools::s_FatalErrorOccured = true;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    bVar2 = false;
    goto LAB_00362dc9;
  }
  cmsys::SystemTools::GetFilenamePath(&local_298,&local_2d8);
  cmsys::SystemTools::MakeDirectory(local_298._M_dataplus._M_p);
  local_2dc = 0;
  bVar2 = cmsys::SystemTools::GetPermissions(local_2d8._M_dataplus._M_p,&local_2dc);
  if (bVar2) {
    cmsys::SystemTools::SetPermissions(local_2d8._M_dataplus._M_p,local_2dc | 0x90);
  }
  _Var5 = _S_out;
  if (append) {
    _Var5 = _S_app;
  }
  std::ofstream::ofstream(local_230,local_2d8._M_dataplus._M_p,_Var5);
  bVar2 = (abStack_210[*(long *)((long)local_230 + -0x18)] & 5) == 0;
  if (bVar2) {
    local_270.Begin._M_current = pbVar6 + 2;
    local_270.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_260.field_2._8_8_ = 0;
    local_240 = '\0';
    local_260.field_2._M_allocated_capacity = (size_type)&local_240;
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_2b8,&local_270,&local_240);
    if ((char *)local_260.field_2._M_allocated_capacity != &local_240) {
      operator_delete((void *)local_260.field_2._M_allocated_capacity,
                      CONCAT71(uStack_23f,local_240) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::ofstream::close();
    if (local_2dc != 0) {
      cmsys::SystemTools::SetPermissions(local_2d8._M_dataplus._M_p,local_2dc);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_00362c92;
  }
  else {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,"failed to open for writing (","");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_270.Begin._M_current);
    if (local_270.Begin._M_current != &local_260) {
      operator_delete(local_270.Begin._M_current,(ulong)(local_260._M_dataplus._M_p + 1));
    }
    std::__cxx11::string::append((char *)&local_2b8);
    std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_2d8._M_dataplus._M_p);
    cmCommand::SetError(&this->super_cmCommand,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
LAB_00362c92:
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
LAB_00362dc9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleWriteCommand(std::vector<std::string> const& args,
  bool append)
{
  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + *i;
    }

  i++;

  if ( !this->Makefile->CanIWriteThisFile(fileName.c_str()) )
    {
    std::string e
      = "attempted to write a file: " + fileName +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir.c_str());

  mode_t mode = 0;

  // Set permissions to writable
  if ( cmSystemTools::GetPermissions(fileName.c_str(), mode) )
    {
    cmSystemTools::SetPermissions(fileName.c_str(),
#if defined( _MSC_VER ) || defined( __MINGW32__ )
      mode | S_IWRITE
#else
      mode | S_IWUSR | S_IWGRP
#endif
    );
    }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(), append?std::ios::app: std::ios::out);
  if ( !file )
    {
    std::string error = "failed to open for writing (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
    }
  std::string message = cmJoin(cmRange(i, args.end()), std::string());
  file << message;
  file.close();
  if(mode)
    {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
    }
  return true;
}